

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O0

uint32_t __thiscall TldDSAsKey::Hash(TldDSAsKey *this)

{
  ulong local_20;
  size_t i;
  uint32_t x;
  TldDSAsKey *this_local;
  
  if (this->hash == 0) {
    i._4_4_ = 0xc001cafe;
    for (local_20 = 0; local_20 < this->name_len; local_20 = local_20 + 1) {
      i._4_4_ = i._4_4_ * 0x65 + (uint)this->name[local_20];
    }
    this->hash = i._4_4_;
  }
  return this->hash;
}

Assistant:

uint32_t TldDSAsKey::Hash()
{
    if (hash == 0)
    {
        uint32_t x = 0xC001CAFE;

        for (size_t i = 0; i < name_len; i++)
        {
            x = (x * 101) + name[i];
        }

        hash = x;
    }

    return hash;
}